

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void decoder_alloc_tile_data(AV1Decoder *pbi,int n_tiles)

{
  undefined8 *puVar1;
  TileDataDec *pTVar2;
  ulong uVar3;
  ulong uVar4;
  
  aom_free(pbi->tile_data);
  pbi->allocated_tiles = 0;
  pTVar2 = (TileDataDec *)aom_memalign(0x20,(long)n_tiles * 0x53a0);
  pbi->tile_data = pTVar2;
  if (pTVar2 == (TileDataDec *)0x0) {
    aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate pbi->tile_data");
  }
  pbi->allocated_tiles = n_tiles;
  uVar3 = 0;
  uVar4 = (ulong)(uint)n_tiles;
  if (n_tiles < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x53a0 - uVar3 != 0; uVar3 = uVar3 + 0x53a0) {
    pTVar2 = pbi->tile_data;
    puVar1 = (undefined8 *)((long)&(pTVar2->dec_row_mt_sync).mi_rows_parse_done + uVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(pTVar2->dec_row_mt_sync).sync_range + uVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(pTVar2->dec_row_mt_sync).allocated_sb_rows + uVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(pTVar2->dec_row_mt_sync).mutex_ + uVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  pbi->allocated_row_mt_sync_rows = 0;
  return;
}

Assistant:

static inline void decoder_alloc_tile_data(AV1Decoder *pbi, const int n_tiles) {
  AV1_COMMON *const cm = &pbi->common;
  aom_free(pbi->tile_data);
  pbi->allocated_tiles = 0;
  CHECK_MEM_ERROR(cm, pbi->tile_data,
                  aom_memalign(32, n_tiles * sizeof(*pbi->tile_data)));
  pbi->allocated_tiles = n_tiles;
  for (int i = 0; i < n_tiles; i++) {
    TileDataDec *const tile_data = pbi->tile_data + i;
    av1_zero(tile_data->dec_row_mt_sync);
  }
  pbi->allocated_row_mt_sync_rows = 0;
}